

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

void hexFrom(char *dest,void *src,size_t count)

{
  byte bVar1;
  size_t sVar2;
  
  for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
    bVar1 = *(byte *)((long)src + sVar2);
    dest[sVar2 * 2] = "0123456789ABCDEF"[bVar1 >> 4];
    dest[sVar2 * 2 + 1] = "0123456789ABCDEF"[bVar1 & 0xf];
  }
  dest[sVar2 * 2] = '\0';
  return;
}

Assistant:

void hexFrom(char* dest, const void* src, size_t count)
{
	ASSERT(memIsDisjoint2(src, count, dest, 2 * count + 1));
	for (; count--; dest += 2, src = (const octet*)src + 1)
		hexFromOUpper(dest, *(const octet*)src);
	*dest = '\0';
}